

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O0

HTTPAPIEX_HANDLE
Blob_CreateHttpConnection
          (char *blobStorageHostname,char *certificates,HTTP_PROXY_OPTIONS *proxyOptions,
          char *networkInterface,size_t timeoutInMilliseconds)

{
  HTTPAPIEX_RESULT HVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  HTTPAPIEX_HANDLE httpApiExHandle;
  size_t timeoutInMilliseconds_local;
  char *networkInterface_local;
  HTTP_PROXY_OPTIONS *proxyOptions_local;
  char *certificates_local;
  char *blobStorageHostname_local;
  
  httpApiExHandle = (HTTPAPIEX_HANDLE)timeoutInMilliseconds;
  timeoutInMilliseconds_local = (size_t)networkInterface;
  networkInterface_local = (char *)proxyOptions;
  proxyOptions_local = (HTTP_PROXY_OPTIONS *)certificates;
  certificates_local = blobStorageHostname;
  if (blobStorageHostname == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                ,"Blob_CreateHttpConnection",0x59,1,
                "Required storage hostname is NULL, blobStorageHostname=%p",certificates_local);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)HTTPAPIEX_Create(blobStorageHostname);
    if ((HTTPAPIEX_HANDLE)l == (HTTPAPIEX_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                  ,"Blob_CreateHttpConnection",0x60,1,"unable to create a HTTPAPIEX_HANDLE");
      }
    }
    else if ((httpApiExHandle == (HTTPAPIEX_HANDLE)0x0) ||
            (HVar1 = HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,"timeout",&httpApiExHandle),
            HVar1 != HTTPAPIEX_ERROR)) {
      if ((proxyOptions_local == (HTTP_PROXY_OPTIONS *)0x0) ||
         (HVar1 = HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,"TrustedCerts",proxyOptions_local),
         HVar1 != HTTPAPIEX_ERROR)) {
        if (((networkInterface_local == (char *)0x0) || (*(long *)networkInterface_local == 0)) ||
           (HVar1 = HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,"proxy_data",networkInterface_local),
           HVar1 != HTTPAPIEX_ERROR)) {
          if ((timeoutInMilliseconds_local != 0) &&
             (HVar1 = HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,"CURLOPT_INTERFACE",
                                          (void *)timeoutInMilliseconds_local),
             HVar1 == HTTPAPIEX_ERROR)) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                        ,"Blob_CreateHttpConnection",0x76,1,"failure in setting network interface");
            }
            HTTPAPIEX_Destroy((HTTPAPIEX_HANDLE)l);
            l = (LOGGER_LOG)0x0;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                      ,"Blob_CreateHttpConnection",0x70,1,"failure in setting proxy options");
          }
          HTTPAPIEX_Destroy((HTTPAPIEX_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                    ,"Blob_CreateHttpConnection",0x6a,1,"failure in setting trusted certificates");
        }
        HTTPAPIEX_Destroy((HTTPAPIEX_HANDLE)l);
        l = (LOGGER_LOG)0x0;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                  ,"Blob_CreateHttpConnection",100,1,"unable to set blob transfer timeout");
      }
      HTTPAPIEX_Destroy((HTTPAPIEX_HANDLE)l);
      l = (LOGGER_LOG)0x0;
    }
  }
  return (HTTPAPIEX_HANDLE)l;
}

Assistant:

HTTPAPIEX_HANDLE Blob_CreateHttpConnection(const char* blobStorageHostname, const char* certificates, const HTTP_PROXY_OPTIONS *proxyOptions, const char* networkInterface, const size_t timeoutInMilliseconds)
{
    HTTPAPIEX_HANDLE httpApiExHandle;
    
    if (blobStorageHostname == NULL)
    {
        LogError("Required storage hostname is NULL, blobStorageHostname=%p", blobStorageHostname);
        httpApiExHandle = NULL;
    }
    else
    {
        if ((httpApiExHandle = HTTPAPIEX_Create(blobStorageHostname)) == NULL)
        {
            LogError("unable to create a HTTPAPIEX_HANDLE");
        }
        else if ((timeoutInMilliseconds != 0) && (HTTPAPIEX_SetOption(httpApiExHandle, OPTION_HTTP_TIMEOUT, &timeoutInMilliseconds) == HTTPAPIEX_ERROR))
        {
            LogError("unable to set blob transfer timeout");
            HTTPAPIEX_Destroy(httpApiExHandle);
            httpApiExHandle = NULL;
        }
        else if ((certificates != NULL) && (HTTPAPIEX_SetOption(httpApiExHandle, OPTION_TRUSTED_CERT, certificates) == HTTPAPIEX_ERROR))
        {
            LogError("failure in setting trusted certificates");
            HTTPAPIEX_Destroy(httpApiExHandle);
            httpApiExHandle = NULL;
        }
        else if ((proxyOptions != NULL && proxyOptions->host_address != NULL) && HTTPAPIEX_SetOption(httpApiExHandle, OPTION_HTTP_PROXY, proxyOptions) == HTTPAPIEX_ERROR)
        {
            LogError("failure in setting proxy options");
            HTTPAPIEX_Destroy(httpApiExHandle);
            httpApiExHandle = NULL;
        }
        else if ((networkInterface != NULL) && HTTPAPIEX_SetOption(httpApiExHandle, OPTION_CURL_INTERFACE, networkInterface) == HTTPAPIEX_ERROR)
        {
            LogError("failure in setting network interface");
            HTTPAPIEX_Destroy(httpApiExHandle);
            httpApiExHandle = NULL;
        }
    }

    return httpApiExHandle;
}